

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  sockaddr local_10;
  
  local_10.sa_data[6] = '\0';
  local_10.sa_data[7] = '\0';
  local_10.sa_data[8] = '\0';
  local_10.sa_data[9] = '\0';
  local_10.sa_data[10] = '\0';
  local_10.sa_data[0xb] = '\0';
  local_10.sa_data[0xc] = '\0';
  local_10.sa_data[0xd] = '\0';
  local_10.sa_family = 2;
  local_10.sa_data._0_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
  local_10.sa_data._2_4_ =
       (uint)__fd >> 0x18 | (__fd & 0xff0000U) >> 8 | (__fd & 0xff00U) << 8 | __fd << 0x18;
  iVar1 = ::connect(this->s,&local_10,0x10);
  iVar2 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    iVar2 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0x73 || iVar2 == 0);
  }
  return iVar2;
}

Assistant:

bool Socket::connect(uint32 ip, uint16 port)
{
  struct sockaddr_in sin;

  memset(&sin,0,sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl(ip);

  if(::connect(s, (struct sockaddr*)&sin, sizeof(sin)) < 0)
  {
    if(ERRNO && ERRNO != EINPROGRESS
#ifdef _WIN32
      && ERRNO != EWOULDBLOCK
#endif
      )
      return false;
  }

  return true;
}